

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CheckVisibilityRules
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  DescriptorProto *descriptor;
  EnumDescriptorProto *descriptor_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  bool bVar1;
  SymbolVisibility SVar2;
  FeatureSet_VisibilityFeature_DefaultSymbolVisibility FVar3;
  pointer *this_00;
  FeatureSet *pFVar4;
  VisibilityCheckerState *in_R8;
  string_view sVar5;
  anon_class_16_2_f884057e visitor;
  anon_class_8_1_629e5235 local_120;
  VoidPtr local_118;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_110;
  string_view local_108;
  reference local_f8;
  EnumDescriptorAndProto *nested_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  *__range2_1;
  VoidPtr local_d0;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_c8;
  string_view local_c0;
  reference local_b0;
  DescriptorAndProto *nested;
  iterator __end2;
  iterator __begin2;
  vector<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
  *__range2;
  undefined1 local_70 [8];
  VisibilityCheckerState state;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  state.namespaced_enums.
  super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)proto;
  VisibilityCheckerState::VisibilityCheckerState((VisibilityCheckerState *)local_70);
  visitor.state = in_R8;
  visitor.this = (DescriptorBuilder *)local_70;
  internal::
  VisitDescriptors<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__2>
            ((internal *)file,
             (FileDescriptor *)
             state.namespaced_enums.
             super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(FileDescriptorProto *)this,visitor)
  ;
  __end2 = std::
           vector<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
           ::begin((vector<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
                    *)&state);
  nested = (DescriptorAndProto *)
           std::
           vector<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
           ::end((vector<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
                  *)&state);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<google::protobuf::DescriptorBuilder::DescriptorAndProto_*,_std::vector<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>_>
                                *)&nested);
    if (!bVar1) break;
    local_b0 = __gnu_cxx::
               __normal_iterator<google::protobuf::DescriptorBuilder::DescriptorAndProto_*,_std::vector<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>_>
               ::operator*(&__end2);
    SVar2 = Descriptor::visibility_keyword(local_b0->descriptor);
    if (SVar2 == VISIBILITY_EXPORT) {
      pFVar4 = Descriptor::features(local_b0->descriptor);
      FVar3 = FeatureSet::default_symbol_visibility(pFVar4);
      if (FVar3 == FeatureSet_VisibilityFeature_DefaultSymbolVisibility_STRICT) {
        sVar5 = Descriptor::full_name(local_b0->descriptor);
        descriptor = local_b0->proto;
        __range2_1 = (vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
                      *)local_b0;
        local_c0 = sVar5;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_d0,
                   (anon_class_8_1_629e5235 *)&__range2_1);
        make_error.invoker_ = p_Stack_c8;
        make_error.ptr_.obj = local_d0.obj;
        AddError(this,local_c0,&descriptor->super_Message,INPUT_TYPE,make_error);
      }
    }
    __gnu_cxx::
    __normal_iterator<google::protobuf::DescriptorBuilder::DescriptorAndProto_*,_std::vector<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>_>
    ::operator++(&__end2);
  }
  this_00 = &state.nested_messages.
             super__Vector_base<google::protobuf::DescriptorBuilder::DescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::DescriptorAndProto>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2_1 = std::
             vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
             ::begin((vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
                      *)this_00);
  nested_1 = (EnumDescriptorAndProto *)
             std::
             vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
             ::end((vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
                    *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto_*,_std::vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>_>
                        *)&nested_1);
    if (!bVar1) break;
    local_f8 = __gnu_cxx::
               __normal_iterator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto_*,_std::vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>_>
               ::operator*(&__end2_1);
    SVar2 = EnumDescriptor::visibility_keyword(local_f8->descriptor);
    if (SVar2 == VISIBILITY_EXPORT) {
      pFVar4 = EnumDescriptor::features(local_f8->descriptor);
      FVar3 = FeatureSet::default_symbol_visibility(pFVar4);
      if (FVar3 == FeatureSet_VisibilityFeature_DefaultSymbolVisibility_STRICT) {
        sVar5 = EnumDescriptor::full_name(local_f8->descriptor);
        descriptor_00 = local_f8->proto;
        local_120.nested = local_f8;
        local_108 = sVar5;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__1,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_118,&local_120);
        make_error_00.invoker_ = p_Stack_110;
        make_error_00.ptr_.obj = local_118.obj;
        AddError(this,local_108,&descriptor_00->super_Message,INPUT_TYPE,make_error_00);
      }
    }
    __gnu_cxx::
    __normal_iterator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto_*,_std::vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>_>
    ::operator++(&__end2_1);
  }
  VisibilityCheckerState::~VisibilityCheckerState((VisibilityCheckerState *)local_70);
  return;
}

Assistant:

void DescriptorBuilder::CheckVisibilityRules(FileDescriptor* file,
                                             const FileDescriptorProto& proto) {
  // Check DefaultSymbolVisibility first.
  //
  // For Edition 2024:
  // If DefaultSymbolVisibility is STRICT enforce it with caveats for:
  //

  VisibilityCheckerState state;

  // Build our state object so we can apply rules based on type.
  internal::VisitDescriptors(
      *file, proto,
      [&](const auto& descriptor, const auto& proto)
          -> decltype(CheckVisibilityRulesVisit(descriptor, proto, state)) {
        CheckVisibilityRulesVisit(descriptor, proto, state);
      });

  // In edition 2024 we only enforce STRICT visibilty rules. There are possibly
  // more rules to come in future editions, but for now just apply the rule for
  // enforcing nested symbol local visibilty. There is a single caveat for,
  // allowing nested enums to have visibility set only when
  //
  // local msg { export enum {} reserved 1 to max; }
  for (auto& nested : state.nested_messages) {
    if (nested.descriptor->visibility_keyword() ==
            SymbolVisibility::VISIBILITY_EXPORT &&
        nested.descriptor->features().default_symbol_visibility() ==
            FeatureSet::VisibilityFeature::STRICT) {
      AddError(
          nested.descriptor->full_name(), *nested.proto,
          DescriptorPool::ErrorCollector::INPUT_TYPE, [&] {
            return absl::StrCat(
                "\"", nested.descriptor->name(),
                "\" is a nested message and cannot be `export` with STRICT "
                "default_symbol_visibility. It must be moved to top-level, "
                "ideally "
                "in its own file in order to be `export`.");
          });
    }
  }

  for (auto& nested : state.nested_enums) {
    if (nested.descriptor->visibility_keyword() ==
            SymbolVisibility::VISIBILITY_EXPORT &&
        nested.descriptor->features().default_symbol_visibility() ==
            FeatureSet::VisibilityFeature::STRICT) {
      // This list contains only enums not considered 'namespaced' by
      // IsEnumNamespaceMessage

      AddError(nested.descriptor->full_name(), *nested.proto,
               DescriptorPool::ErrorCollector::INPUT_TYPE, [&] {
                 return absl::StrCat(
                     "\"", nested.descriptor->name(),
                     "\" is a nested enum and cannot be marked `export` with "
                     "STRICT "
                     "default_symbol_visibility. It must be moved to "
                     "top-level, ideally "
                     "in its own file in order to be `export`. For C++ "
                     "namespacing of enums in a messages use: `local "
                     "message <OuterNamespace> { export enum ",
                     nested.descriptor->name(), " {...} reserved 1 to max; }`");
               });
    }

    // Enforce Future rules here:
  }
}